

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O2

int ffpcom(fitsfile *fptr,char *comm,int *status)

{
  size_t sVar1;
  char card [81];
  
  if (0 < *status) {
    return *status;
  }
  for (sVar1 = strlen(comm); 0 < (int)sVar1; sVar1 = (size_t)((int)sVar1 - 0x48)) {
    builtin_strncpy(card,"COMMENT ",9);
    strncat(card,comm,0x48);
    ffprec(fptr,card,status);
    comm = comm + 0x48;
  }
  return *status;
}

Assistant:

int ffpcom( fitsfile *fptr,      /* I - FITS file pointer   */
            const char  *comm,   /* I - comment string      */
            int   *status)       /* IO - error status       */
/*
  Write 1 or more COMMENT keywords.  If the comment string is too
  long to fit on a single keyword (72 chars) then it will automatically
  be continued on multiple CONTINUE keywords.
*/
{
    char card[FLEN_CARD];
    int len, ii;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    len = strlen(comm);
    ii = 0;

    for (; len > 0; len -= 72)
    {
        strcpy(card, "COMMENT ");
        strncat(card, &comm[ii], 72);
        ffprec(fptr, card, status);
        ii += 72;
    }

    return(*status);
}